

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::assign<float>
          (CImg<unsigned_char> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  undefined8 uVar1;
  CImgArgumentException *this_00;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CImg<unsigned_char> *pCVar5;
  uint *in_RDI;
  byte in_stack_00000008;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar9;
  
  if ((in_stack_00000008 & 1) != 0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    uVar6 = *in_RDI;
    uVar7 = in_RDI[1];
    uVar8 = in_RDI[2];
    uVar9 = in_RDI[3];
    uVar1 = *(undefined8 *)(in_RDI + 6);
    pcVar2 = "non-";
    if ((in_RDI[4] & 1) != 0) {
      pcVar2 = "";
    }
    pcVar3 = pixel_type();
    pcVar4 = CImg<float>::pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign() : Invalid assignment request of shared instance from (%s*) buffer(pixel types are different)."
               ,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9,uVar1,pcVar2,pcVar3,pcVar4);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  pCVar5 = assign<float>((CImg<unsigned_char> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                         (uint)in_stack_ffffffffffffff88,
                         (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (uint)in_stack_ffffffffffffff80);
  return pCVar5;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y,
                    const unsigned int size_z, const unsigned int size_c, const bool is_shared) {
      if (is_shared)
        throw CImgArgumentException(_cimg_instance
                                    "assign() : Invalid assignment request of shared instance from (%s*) buffer"
                                    "(pixel types are different).",
                                    cimg_instance,
                                    CImg<t>::pixel_type());
      return assign(values,size_x,size_y,size_z,size_c);
    }